

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.cpp
# Opt level: O1

void __thiscall gamespace::BoardTile::__introspect(BoardTile *this,size_t off)

{
  ostream *poVar1;
  long *local_40;
  long local_38;
  long local_30 [2];
  
  local_40 = local_30;
  std::__cxx11::string::_M_construct((ulong)&local_40,(char)off);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_40,local_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"BoardTile[",10);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->_p).x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->_p).y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  if (this->_unit != (Unit *)0x0) {
    Unit::__introspect(this->_unit,off + 2);
  }
  return;
}

Assistant:

void BoardTile::__introspect(size_t off) {
    std::cout << std::string(off, ' ') << "BoardTile[" << _p.x << "," << _p.y << "]" << std::endl;
    if(_unit) _unit->__introspect(off + 2);
}